

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

GCstr * lj_ctype_repr_int64(lua_State *L,uint64_t n,int isunsigned)

{
  bool bVar1;
  GCstr *pGVar2;
  char *pcVar3;
  byte *pbVar4;
  byte *str;
  bool bVar5;
  char buf [24];
  
  buf[0x16] = 'L';
  buf[0x17] = 'L';
  if (isunsigned == 0) {
    pcVar3 = buf + 0x16;
    bVar5 = -1 < (long)n;
    if ((long)n < 1) {
      n = -n;
    }
  }
  else {
    pcVar3 = buf + 0x15;
    buf[0x15] = 'U';
    bVar5 = true;
  }
  pbVar4 = (byte *)(pcVar3 + -1);
  do {
    str = pbVar4;
    *str = (byte)(n % 10) | 0x30;
    pbVar4 = str + -1;
    bVar1 = 9 < n;
    n = n / 10;
  } while (bVar1);
  if (!bVar5) {
    *pbVar4 = 0x2d;
    str = pbVar4;
  }
  pGVar2 = lj_str_new(L,(char *)str,(long)&stack0x00000000 - (long)str);
  return pGVar2;
}

Assistant:

GCstr *lj_ctype_repr_int64(lua_State *L, uint64_t n, int isunsigned)
{
  char buf[1+20+3];
  char *p = buf+sizeof(buf);
  int sign = 0;
  *--p = 'L'; *--p = 'L';
  if (isunsigned) {
    *--p = 'U';
  } else if ((int64_t)n < 0) {
    n = (uint64_t)-(int64_t)n;
    sign = 1;
  }
  do { *--p = (char)('0' + n % 10); } while (n /= 10);
  if (sign) *--p = '-';
  return lj_str_new(L, p, (size_t)(buf+sizeof(buf)-p));
}